

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

void finish_productions(Grammar *g)

{
  Rule **ppRVar1;
  uint uVar2;
  Production *p;
  Elem **ppEVar3;
  Rule **ppRVar4;
  Rule *r;
  Elem *pEVar5;
  anon_struct_40_4_d8687ec6_for_rules *v;
  
  p = *(g->productions).v;
  r = new_rule(g,p);
  ppEVar3 = (r->elems).v;
  if (ppEVar3 == (Elem **)0x0) {
    pEVar5 = new_elem_nterm((Production *)0x0,r);
    (r->elems).v = (r->elems).e;
    uVar2 = (r->elems).n;
    (r->elems).n = uVar2 + 1;
    (r->elems).e[uVar2] = pEVar5;
  }
  else {
    uVar2 = (r->elems).n;
    if (ppEVar3 == (r->elems).e) {
      if (2 < uVar2) goto LAB_0013b311;
    }
    else if ((uVar2 & 7) == 0) {
LAB_0013b311:
      pEVar5 = new_elem_nterm((Production *)0x0,r);
      vec_add_internal(&r->elems,pEVar5);
      goto LAB_0013b32d;
    }
    pEVar5 = new_elem_nterm((Production *)0x0,r);
    uVar2 = (r->elems).n;
    (r->elems).n = uVar2 + 1;
    (r->elems).v[uVar2] = pEVar5;
  }
LAB_0013b32d:
  ppRVar4 = (p->rules).v;
  ppRVar1 = (p->rules).e;
  if (ppRVar4 == (Rule **)0x0) {
    (p->rules).v = ppRVar1;
    uVar2 = (p->rules).n;
    (p->rules).n = uVar2 + 1;
    (p->rules).e[uVar2] = r;
    goto LAB_0013b383;
  }
  v = &p->rules;
  uVar2 = v->n;
  if (ppRVar4 == ppRVar1) {
    if (2 < uVar2) goto LAB_0013b378;
  }
  else if ((uVar2 & 7) == 0) {
LAB_0013b378:
    vec_add_internal(v,r);
    goto LAB_0013b383;
  }
  v->n = uVar2 + 1;
  ppRVar4[uVar2] = r;
LAB_0013b383:
  ((*(r->elems).v)->e).nterm = (g->productions).v[1];
  return;
}

Assistant:

void finish_productions(Grammar *g) {
  Production *pp = g->productions.v[0];
  Rule *rr = new_rule(g, pp);
  vec_add(&rr->elems, new_elem_nterm(NULL, rr));
  vec_add(&pp->rules, rr);
  rr->elems.v[0]->e.nterm = g->productions.v[1];
}